

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# robin_hood.h
# Opt level: O1

void __thiscall
robin_hood::detail::
Table<true,_80UL,_Rml::Character,_Rml::FontGlyph,_robin_hood::hash<Rml::Character,_void>,_std::equal_to<Rml::Character>_>
::shiftUp(Table<true,_80UL,_Rml::Character,_Rml::FontGlyph,_robin_hood::hash<Rml::Character,_void>,_std::equal_to<Rml::Character>_>
          *this,size_t startIdx,size_t insertion_idx)

{
  byte **ppbVar1;
  byte **ppbVar2;
  undefined8 *puVar3;
  undefined8 *puVar4;
  Node *pNVar5;
  undefined8 uVar6;
  void *pvVar7;
  Vector2i VVar8;
  value_type *pvVar9;
  value_type *pvVar10;
  int iVar11;
  undefined4 uVar12;
  long lVar13;
  long lVar14;
  
  pNVar5 = this->mKeyVals;
  pNVar5[startIdx].mData.first = pNVar5[startIdx - 1].mData.first;
  pvVar9 = &pNVar5[startIdx - 1].mData;
  iVar11 = (pvVar9->second).advance;
  uVar12 = *(undefined4 *)&(pvVar9->second).field_0xc;
  pvVar10 = &pNVar5[startIdx].mData;
  (pvVar10->second).bearing = (pvVar9->second).bearing;
  (pvVar10->second).advance = iVar11;
  *(undefined4 *)&(pvVar10->second).field_0xc = uVar12;
  ppbVar1 = &pNVar5[startIdx - 1].mData.second.bitmap_data;
  VVar8 = *(Vector2i *)(ppbVar1 + 1);
  ppbVar2 = &pNVar5[startIdx].mData.second.bitmap_data;
  *ppbVar2 = *ppbVar1;
  *(Vector2i *)(ppbVar2 + 1) = VVar8;
  pNVar5[startIdx].mData.second.color_format = pNVar5[startIdx - 1].mData.second.color_format;
  pNVar5[startIdx].mData.second.bitmap_owned_data._M_t.
  super___uniq_ptr_impl<unsigned_char,_std::default_delete<unsigned_char[]>_>._M_t.
  super__Tuple_impl<0UL,_unsigned_char_*,_std::default_delete<unsigned_char[]>_>.
  super__Head_base<0UL,_unsigned_char_*,_false>._M_head_impl =
       pNVar5[startIdx - 1].mData.second.bitmap_owned_data._M_t.
       super___uniq_ptr_impl<unsigned_char,_std::default_delete<unsigned_char[]>_>._M_t.
       super__Tuple_impl<0UL,_unsigned_char_*,_std::default_delete<unsigned_char[]>_>.
       super__Head_base<0UL,_unsigned_char_*,_false>._M_head_impl;
  pNVar5[startIdx - 1].mData.second.bitmap_owned_data._M_t.
  super___uniq_ptr_impl<unsigned_char,_std::default_delete<unsigned_char[]>_>._M_t.
  super__Tuple_impl<0UL,_unsigned_char_*,_std::default_delete<unsigned_char[]>_>.
  super__Head_base<0UL,_unsigned_char_*,_false>._M_head_impl = (uchar *)0x0;
  if (startIdx - 1 != insertion_idx) {
    lVar13 = startIdx * 0x38 + -8;
    lVar14 = (insertion_idx - startIdx) + 1;
    do {
      pNVar5 = this->mKeyVals;
      *(undefined4 *)((long)pNVar5 + lVar13 + -0x30) =
           *(undefined4 *)((long)pNVar5 + lVar13 + -0x68);
      puVar3 = (undefined8 *)((long)pNVar5 + lVar13 + -0x60);
      uVar6 = puVar3[1];
      puVar4 = (undefined8 *)((long)pNVar5 + lVar13 + -0x28);
      *puVar4 = *puVar3;
      puVar4[1] = uVar6;
      puVar3 = (undefined8 *)((long)pNVar5 + lVar13 + -0x50);
      uVar6 = puVar3[1];
      puVar4 = (undefined8 *)((long)pNVar5 + lVar13 + -0x18);
      *puVar4 = *puVar3;
      puVar4[1] = uVar6;
      *(undefined4 *)((long)pNVar5 + lVar13 + -8) = *(undefined4 *)((long)pNVar5 + lVar13 + -0x40);
      uVar6 = *(undefined8 *)((long)&pNVar5[-1].mData.first + lVar13);
      *(undefined8 *)((long)&pNVar5[-1].mData.first + lVar13) = 0;
      pvVar7 = *(void **)((long)&(pNVar5->mData).first + lVar13);
      *(undefined8 *)((long)&(pNVar5->mData).first + lVar13) = uVar6;
      if (pvVar7 != (void *)0x0) {
        operator_delete__(pvVar7);
      }
      lVar13 = lVar13 + -0x38;
      lVar14 = lVar14 + 1;
    } while (lVar14 != 0);
  }
  if (startIdx != insertion_idx) {
    do {
      this->mInfo[startIdx] = this->mInfo[startIdx - 1] + (char)this->mInfoInc;
      if (0xff < (uint)this->mInfo[startIdx] + this->mInfoInc) {
        this->mMaxNumElementsAllowed = 0;
      }
      startIdx = startIdx - 1;
    } while (insertion_idx != startIdx);
  }
  return;
}

Assistant:

void
    shiftUp(size_t startIdx,
            size_t const insertion_idx) noexcept(std::is_nothrow_move_assignable<Node>::value) {
        auto idx = startIdx;
        ::new (static_cast<void*>(mKeyVals + idx)) Node(std::move(mKeyVals[idx - 1]));
        while (--idx != insertion_idx) {
            mKeyVals[idx] = std::move(mKeyVals[idx - 1]);
        }

        idx = startIdx;
        while (idx != insertion_idx) {
            ROBIN_HOOD_COUNT(shiftUp)
            mInfo[idx] = static_cast<uint8_t>(mInfo[idx - 1] + mInfoInc);
            if (ROBIN_HOOD_UNLIKELY(mInfo[idx] + mInfoInc > 0xFF)) {
                mMaxNumElementsAllowed = 0;
            }
            --idx;
        }
    }